

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int process_frame_header(jpeg *z,int scan)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  uint8 **ppuVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int *piVar16;
  uint uVar17;
  char *pcVar18;
  bool bVar19;
  
  iVar3 = get8(&z->s);
  iVar4 = get8(&z->s);
  iVar4 = iVar4 + iVar3 * 0x100;
  pcVar18 = "Corrupt JPEG";
  if (10 < iVar4) {
    iVar3 = get8(&z->s);
    if (iVar3 == 8) {
      iVar3 = get8(&z->s);
      iVar5 = get8(&z->s);
      uVar6 = iVar5 + iVar3 * 0x100;
      (z->s).img_y = uVar6;
      if (uVar6 == 0) {
        pcVar18 = "JPEG format not supported: delayed height";
      }
      else {
        iVar3 = get8(&z->s);
        iVar5 = get8(&z->s);
        uVar6 = iVar5 + iVar3 * 0x100;
        (z->s).img_x = uVar6;
        if ((uVar6 != 0) && (uVar7 = get8(&z->s), (uVar7 & 0xfffffffd) == 1)) {
          (z->s).img_n = uVar7;
          if (0 < (int)uVar7) {
            lVar13 = 0;
            do {
              *(undefined8 *)((long)&z->img_comp[0].data + lVar13) = 0;
              *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar13) = 0;
              lVar13 = lVar13 + 0x48;
            } while ((ulong)uVar7 * 0x48 != lVar13);
          }
          if (iVar4 == uVar7 * 3 + 8) {
            piVar16 = &z->img_comp[0].tq;
            uVar14 = 0;
            while( true ) {
              uVar7 = (z->s).img_n;
              lVar13 = (long)(int)uVar7;
              if (lVar13 <= (long)uVar14) break;
              uVar7 = get8(&z->s);
              ((anon_struct_72_14_dbcb52e3 *)(piVar16 + -3))->id = uVar7;
              if (uVar14 + 1 != (ulong)uVar7 && uVar14 != uVar7) {
                failure_reason = pcVar18;
                return 0;
              }
              uVar7 = get8(&z->s);
              piVar16[-2] = (int)uVar7 >> 4;
              if (uVar7 < 0x10) {
                failure_reason = pcVar18;
                return 0;
              }
              if (4 < (int)uVar7 >> 4) {
                failure_reason = pcVar18;
                return 0;
              }
              piVar16[-1] = uVar7 & 0xf;
              if ((uVar7 & 0xf) - 5 < 0xfffffffc) {
                failure_reason = pcVar18;
                return 0;
              }
              iVar3 = get8(&z->s);
              *piVar16 = iVar3;
              piVar16 = piVar16 + 0x12;
              uVar14 = uVar14 + 1;
              if (3 < iVar3) {
                failure_reason = pcVar18;
                return 0;
              }
            }
            uVar1 = (z->s).img_x;
            uVar2 = (z->s).img_y;
            if ((uint)((0x40000000 / (ulong)uVar1) / (ulong)uVar7) < uVar2) {
              pcVar18 = "Image too large to decode";
            }
            else {
              uVar15 = 1;
              uVar17 = 1;
              if (0 < (int)uVar7) {
                uVar17 = 1;
                lVar11 = 0;
                uVar15 = 1;
                do {
                  uVar8 = *(uint *)((long)&z->img_comp[0].h + lVar11);
                  uVar9 = *(uint *)((long)&z->img_comp[0].v + lVar11);
                  if ((int)uVar15 < (int)uVar8) {
                    uVar15 = uVar8;
                  }
                  if ((int)uVar17 < (int)uVar9) {
                    uVar17 = uVar9;
                  }
                  lVar11 = lVar11 + 0x48;
                } while (lVar13 * 0x48 != lVar11);
              }
              z->img_h_max = uVar15;
              z->img_v_max = uVar17;
              z->img_mcu_w = uVar15 * 8;
              z->img_mcu_h = uVar17 * 8;
              uVar8 = ((uVar1 + uVar15 * 8) - 1) / (uVar15 * 8);
              z->img_mcu_x = uVar8;
              uVar9 = ((uVar2 + uVar17 * 8) - 1) / (uVar17 * 8);
              z->img_mcu_y = uVar9;
              if ((int)uVar7 < 1) {
                return 1;
              }
              ppuVar12 = &z->img_comp[0].linebuf;
              lVar11 = 1;
              while( true ) {
                *(uint *)((long)ppuVar12 + -0x24) =
                     (*(int *)((long)ppuVar12 + -0x3c) * uVar1 + (uVar15 - 1)) / uVar15;
                *(uint *)(ppuVar12 + -4) = (*(int *)(ppuVar12 + -7) * uVar2 + (uVar17 - 1)) / uVar17
                ;
                iVar4 = *(int *)((long)ppuVar12 + -0x3c) * uVar8 * 8;
                *(int *)((long)ppuVar12 + -0x1c) = iVar4;
                iVar3 = *(int *)(ppuVar12 + -7) * uVar9 * 8;
                *(int *)(ppuVar12 + -3) = iVar3;
                pvVar10 = malloc((long)(int)(iVar3 * iVar4 | 0xf));
                ppuVar12[-1] = (uint8 *)pvVar10;
                if (pvVar10 == (void *)0x0) break;
                ppuVar12[-2] = (uint8 *)((long)pvVar10 + 0xfU & 0xfffffffffffffff0);
                *ppuVar12 = (uint8 *)0x0;
                ppuVar12 = ppuVar12 + 9;
                bVar19 = lVar11 == lVar13;
                lVar11 = lVar11 + 1;
                if (bVar19) {
                  return 1;
                }
              }
              pcVar18 = "Out of memory";
              if (lVar11 != 1) {
                do {
                  uVar7 = (int)lVar11 - 2;
                  free(z->img_comp[uVar7].raw_data);
                  z->img_comp[uVar7].data = (uint8 *)0x0;
                  lVar11 = lVar11 + -1;
                } while (1 < lVar11);
              }
            }
          }
        }
      }
    }
    else {
      pcVar18 = "JPEG format not supported: 8-bit only";
    }
  }
  failure_reason = pcVar18;
  return 0;
}

Assistant:

static int process_frame_header(jpeg *z, int scan)
{
   stbi *s = &z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = get16(s);         if (Lf < 11) return e("bad SOF len","Corrupt JPEG"); // JPEG
   p  = get8(s);          if (p != 8) return e("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = get16(s);   if (s->img_y == 0) return e("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = get16(s);   if (s->img_x == 0) return e("0 width","Corrupt JPEG"); // JPEG requires
   c = get8(s);
   if (c != 3 && c != 1) return e("bad component count","Corrupt JPEG");    // JFIF requires
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return e("bad SOF len","Corrupt JPEG");

   for (i=0; i < s->img_n; ++i) {
      z->img_comp[i].id = get8(s);
      if (z->img_comp[i].id != i+1)   // JFIF requires
         if (z->img_comp[i].id != i)  // some version of jpegtran outputs non-JFIF-compliant files!
            return e("bad component ID","Corrupt JPEG");
      q = get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return e("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return e("bad V","Corrupt JPEG");
      z->img_comp[i].tq = get8(s);  if (z->img_comp[i].tq > 3) return e("bad TQ","Corrupt JPEG");
   }

   if (scan != SCAN_load) return 1;

   if ((1 << 30) / s->img_x / s->img_n < s->img_y) return e("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].raw_data = malloc(z->img_comp[i].w2 * z->img_comp[i].h2+15);
      if (z->img_comp[i].raw_data == NULL) {
         for(--i; i >= 0; --i) {
            free(z->img_comp[i].raw_data);
            z->img_comp[i].data = NULL;
         }
         return e("outofmem", "Out of memory");
      }
      // align blocks for installable-idct using mmx/sse
      z->img_comp[i].data = (uint8*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      z->img_comp[i].linebuf = NULL;
   }

   return 1;
}